

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalMapString.h
# Opt level: O0

void __thiscall
Js::EvalMapStringInternal<true>::EvalMapStringInternal
          (EvalMapStringInternal<true> *this,FinalizableObject *obj,char16 *content,int charLength,
          ModuleID moduleID,BOOL strict,BOOL isLibraryCode)

{
  hash_t hVar1;
  BOOL strict_local;
  ModuleID moduleID_local;
  int charLength_local;
  char16 *content_local;
  FinalizableObject *obj_local;
  EvalMapStringInternal<true> *this_local;
  
  this->owningVar = obj;
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer(&this->str,content,charLength);
  this->moduleID = moduleID;
  this->strict = strict;
  this->isLibraryCode = isLibraryCode;
  hVar1 = JsUtil::CharacterBuffer<char16_t>::FastHash(&this->str);
  this->hash = hVar1 << 1 | 1;
  return;
}

Assistant:

EvalMapStringInternal(FinalizableObject* obj, __in_ecount(charLength) char16 const* content, int charLength, ModuleID moduleID, BOOL strict, BOOL isLibraryCode)
            : owningVar(obj), str(content, charLength), moduleID(moduleID), strict(strict), isLibraryCode(isLibraryCode)
        {
            // NOTE: this hash is not equivalent to the character buffer hash
            // Don't use a CharacteBuffer to do a map lookup on the EvalMapString.
            if (fastHash)
            {
                hash = TAGHASH(str.FastHash());
            }
            else
            {
                hash = TAGHASH((hash_t)str);
            }
        }